

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::SeparationPart::SeparationPart
          (SeparationPart *this,ReasonForSeparation RFS,PreEntityIndicator PEI,
          EntityIdentifier *PEID,NamedLocationIdentifier *SL)

{
  KUINT16 KVar1;
  
  VariableParameter::VariableParameter(&this->super_VariableParameter);
  (this->super_VariableParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SeparationPart_00226c98;
  this->m_ui8Reason = (KUINT8)RFS;
  this->m_ui8PreEntIndicator = (KUINT8)PEI;
  this->m_ui8Padding = '\0';
  (this->m_ParentEntId).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00224f60;
  KVar1 = (PEID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_ParentEntId).super_SimulationIdentifier.m_ui16SiteID =
       (PEID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_ParentEntId).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_ParentEntId).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00224c00;
  *(undefined2 *)&(this->m_ParentEntId).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(PEID->super_SimulationIdentifier).field_0xc;
  this->m_ui16Padding = 0;
  (this->m_StationLoc).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__NamedLocationIdentifier_00226318;
  KVar1 = SL->m_ui16StnNum;
  (this->m_StationLoc).m_ui16StnName = SL->m_ui16StnName;
  (this->m_StationLoc).m_ui16StnNum = KVar1;
  (this->super_VariableParameter).m_ui8VarParamType = '\x03';
  return;
}

Assistant:

KDIS::DATA_TYPE::SeparationPart::SeparationPart(ReasonForSeparation RFS, PreEntityIndicator PEI, const EntityIdentifier & PEID, const NamedLocationIdentifier & SL) :
    m_ui8Reason(RFS),
    m_ui8PreEntIndicator(PEI),
    m_ui8Padding(0),
    m_ParentEntId(PEID),
    m_ui16Padding(0),
    m_StationLoc(SL)
{
    m_ui8VarParamType = SeparationPartType;
}